

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum.c
# Opt level: O1

void Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
               (uint32_t len,uint64_t *n,uint64_t mu,uint64_t *r2,uint64_t *a,uint32_t bBits,
               uint64_t *b,uint64_t *res)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  uint64_t *puVar4;
  uint64_t *n_00;
  uint64_t *nInv_u64;
  size_t __n;
  uint64_t uVar5;
  byte bVar6;
  sbyte sVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint64_t *puVar11;
  uint64_t *puVar12;
  uint32_t uVar13;
  ulong uVar14;
  undefined4 in_register_0000008c;
  uint64_t *os_15;
  uint64_t *puVar15;
  uint64_t *puVar16;
  uint64_t *puVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint64_t uStack_110;
  ulong local_108;
  uint64_t *local_100;
  uint64_t *local_f8;
  uint64_t *local_f0;
  uint64_t *local_e8;
  uint64_t *local_e0;
  uint64_t *local_d8;
  uint64_t *local_d0;
  ulong local_c8;
  uint64_t *local_c0;
  uint64_t *local_b8;
  uint64_t *local_b0;
  uint64_t *local_a8;
  uint64_t *local_a0;
  uint64_t *local_98;
  uint64_t *ctx_r2;
  uint local_84;
  uint64_t *local_80;
  ulong local_78;
  uint64_t *local_70;
  uint64_t *local_68;
  uint64_t *local_60;
  uint64_t *os;
  uint64_t *local_50;
  uint64_t *ctx_n;
  size_t local_40;
  ulong local_38;
  
  local_78 = CONCAT44(in_register_0000008c,bBits);
  local_38 = (ulong)len;
  uVar20 = (ulong)len;
  uVar19 = uVar20 * 8 + 0xf & 0xfffffffffffffff0;
  lVar3 = -uVar19;
  puVar11 = (uint64_t *)((long)&local_108 + lVar3);
  sVar1 = uVar20 * 8;
  ctx_r2 = n;
  local_68 = r2;
  local_60 = a;
  ctx_n = (uint64_t *)mu;
  *(undefined8 *)((long)&uStack_110 + lVar3) = 0x13943a;
  memset(puVar11,0,sVar1);
  puVar15 = ctx_n;
  puVar4 = local_60;
  puVar12 = local_68;
  puVar17 = ctx_r2;
  *(undefined8 *)((long)&uStack_110 + lVar3) = 0x13945b;
  Hacl_Bignum_Montgomery_bn_to_mont_u64(len,puVar17,(uint64_t)puVar15,puVar12,puVar4,puVar11);
  puVar17 = (uint64_t *)((long)puVar11 - uVar19);
  local_40 = sVar1;
  puVar17[-1] = 0x139475;
  memset(puVar17,0,sVar1);
  local_60 = puVar17;
  if ((uint)local_78 < 200) {
    uVar19 = (ulong)(uint)((int)local_38 * 2);
    puVar16 = puVar17 + -uVar19;
    puVar15 = (uint64_t *)0x0;
    puVar16[-1] = 0x1394a9;
    memset(puVar16,0,uVar19 * 8);
    sVar1 = local_40;
    puVar12 = ctx_r2;
    puVar16[-1] = 0x1394bc;
    memcpy(puVar16,puVar12,sVar1);
    sVar1 = local_40;
    puVar12 = local_68;
    os = puVar16 + uVar20;
    puVar16[-1] = 0x1394d1;
    memcpy(puVar16 + uVar20,puVar12,sVar1);
    uVar19 = local_38;
    puVar4 = ctx_n;
    puVar12 = os;
    local_50 = puVar16;
    puVar16[-1] = 0x1394ec;
    Hacl_Bignum_Montgomery_bn_from_mont_u64
              ((uint32_t)uVar19,puVar16,(uint64_t)puVar4,puVar12,puVar17);
    uVar13 = (uint32_t)local_38;
    if ((int)local_78 == 0) {
      uVar19 = 0;
    }
    else {
      local_40 = 0;
      do {
        local_68 = puVar15;
        uVar8 = ~(uint)puVar15 + (int)local_78;
        uVar19 = (ulong)((b[uVar8 >> 6] >> ((ulong)uVar8 & 0x3f) & 1) != 0);
        if (uVar13 != 0) {
          uVar10 = 0;
          do {
            uVar2 = puVar11[uVar10];
            uVar14 = (uVar2 ^ puVar17[uVar10]) & -(local_40 ^ uVar19);
            puVar17[uVar10] = puVar17[uVar10] ^ uVar14;
            puVar11[uVar10] = uVar14 ^ uVar2;
            uVar10 = uVar10 + 1;
          } while (uVar20 != uVar10);
        }
        puVar4 = ctx_n;
        puVar12 = local_50;
        puVar17 = local_60;
        local_40 = uVar19;
        puVar16[-1] = 0x13957b;
        bn_almost_mont_mul_u64(uVar13,puVar12,(uint64_t)puVar4,puVar11,puVar17,puVar11);
        puVar17 = local_60;
        puVar16[-1] = 0x139593;
        bn_almost_mont_sqr_u64(uVar13,puVar12,(uint64_t)puVar4,puVar17,puVar17);
        uVar8 = (int)local_68 + 1;
        puVar15 = (uint64_t *)(ulong)uVar8;
        uVar19 = local_40;
      } while (uVar8 != (uint)local_78);
    }
    puVar15 = local_60;
    if (uVar13 != 0) {
      uVar10 = 0;
      do {
        uVar2 = puVar11[uVar10];
        uVar14 = (uVar2 ^ puVar15[uVar10]) & -uVar19;
        puVar15[uVar10] = puVar15[uVar10] ^ uVar14;
        puVar11[uVar10] = uVar14 ^ uVar2;
        uVar10 = uVar10 + 1;
      } while (uVar20 != uVar10);
    }
  }
  else {
    local_84 = (uint)local_78 - 1 >> 6;
    local_70 = (uint64_t *)(ulong)(uint)((int)local_38 * 2);
    sVar1 = (long)local_70 * 8;
    puVar17 = puVar17 + -(long)local_70;
    local_50 = puVar17;
    puVar17[-1] = 0x1395e4;
    memset(puVar17,0,sVar1);
    __n = local_40;
    puVar12 = ctx_r2;
    puVar17[-1] = 0x1395fa;
    memcpy(puVar17,puVar12,__n);
    puVar12 = local_68;
    local_98 = puVar17 + uVar20;
    puVar17[-1] = 0x139611;
    memcpy(puVar17 + uVar20,puVar12,__n);
    local_108 = (ulong)(uint)((int)local_38 << 4);
    sVar1 = local_108 * 8;
    puVar16 = puVar17 + -local_108;
    os = puVar16;
    puVar16[-1] = 0x13963b;
    memset(puVar16,0,sVar1);
    puVar16 = (uint64_t *)((long)puVar16 - uVar19);
    local_c8 = uVar19;
    puVar16[-1] = 0x139658;
    memset(puVar16,0,__n);
    uVar19 = local_38;
    puVar15 = ctx_n;
    puVar4 = local_50;
    puVar12 = os;
    puVar17 = local_98;
    local_80 = os + uVar20;
    puVar16[-1] = 0x13967f;
    Hacl_Bignum_Montgomery_bn_from_mont_u64
              ((uint32_t)uVar19,puVar4,(uint64_t)puVar15,puVar17,puVar12);
    puVar17 = local_80;
    puVar16[-1] = 0x13968e;
    memcpy(puVar17,puVar11,__n);
    puVar15 = ctx_n;
    puVar17 = local_80;
    uVar13 = (uint32_t)local_38;
    puVar16[-1] = 0x1396ab;
    bn_almost_mont_sqr_u64(uVar13,puVar4,(uint64_t)puVar15,puVar17,puVar16);
    sVar1 = local_40;
    puVar17 = os + (long)local_70;
    local_c0 = puVar17;
    puVar16[-1] = 0x1396ca;
    memcpy(puVar17,puVar16,sVar1);
    puVar12 = local_50;
    puVar17 = local_c0;
    puVar16[-1] = 0x1396e6;
    bn_almost_mont_mul_u64(uVar13,puVar12,(uint64_t)puVar15,puVar11,puVar17,puVar16);
    sVar1 = local_40;
    puVar12 = os;
    local_a0 = (uint64_t *)(ulong)(uVar13 * 3);
    puVar17 = os + (long)local_a0;
    local_e8 = puVar17;
    puVar16[-1] = 0x13970d;
    memcpy(puVar17,puVar16,sVar1);
    puVar15 = ctx_n;
    puVar4 = local_50;
    puVar17 = local_c0;
    puVar16[-1] = 0x139727;
    bn_almost_mont_sqr_u64(uVar13,puVar4,(uint64_t)puVar15,puVar17,puVar16);
    sVar1 = local_40;
    local_a8 = (uint64_t *)(ulong)(uVar13 * 4);
    puVar12 = puVar12 + (long)local_a8;
    local_b8 = puVar12;
    puVar16[-1] = 0x13974d;
    memcpy(puVar12,puVar16,sVar1);
    puVar12 = ctx_n;
    puVar4 = local_50;
    puVar17 = local_b8;
    puVar16[-1] = 0x13976d;
    bn_almost_mont_mul_u64(uVar13,puVar4,(uint64_t)puVar12,puVar11,puVar17,puVar16);
    sVar1 = local_40;
    puVar17 = os;
    local_68 = (uint64_t *)(ulong)(uVar13 * 5);
    puVar12 = os + (long)local_68;
    local_e0 = puVar12;
    puVar16[-1] = 0x139798;
    memcpy(puVar12,puVar16,sVar1);
    uVar19 = local_38;
    puVar15 = ctx_n;
    puVar12 = local_e8;
    puVar16[-1] = 0x1397b5;
    bn_almost_mont_sqr_u64((uint32_t)uVar19,puVar4,(uint64_t)puVar15,puVar12,puVar16);
    sVar1 = local_40;
    puVar17 = puVar17 + (uint)((int)local_70 * 3);
    local_d8 = puVar17;
    puVar16[-1] = 0x1397d7;
    memcpy(puVar17,puVar16,sVar1);
    uVar19 = local_38;
    puVar12 = local_50;
    puVar16[-1] = 0x1397f0;
    bn_almost_mont_mul_u64((uint32_t)uVar19,puVar12,(uint64_t)puVar15,puVar11,puVar17,puVar16);
    sVar1 = local_40;
    puVar12 = os;
    uVar13 = (uint32_t)local_38;
    local_b0 = (uint64_t *)(ulong)(uVar13 * 8);
    puVar17 = os + uVar13 * 7;
    local_d0 = puVar17;
    puVar16[-1] = 0x139828;
    memcpy(puVar17,puVar16,sVar1);
    puVar15 = ctx_n;
    puVar4 = local_50;
    puVar17 = local_b8;
    puVar16[-1] = 0x139842;
    bn_almost_mont_sqr_u64(uVar13,puVar4,(uint64_t)puVar15,puVar17,puVar16);
    sVar1 = local_40;
    puVar12 = puVar12 + (long)local_b0;
    puVar16[-1] = 0x139863;
    memcpy(puVar12,puVar16,sVar1);
    uVar19 = local_38;
    puVar17 = ctx_n;
    puVar4 = local_50;
    local_b0 = puVar12;
    puVar16[-1] = 0x139887;
    bn_almost_mont_mul_u64((uint32_t)uVar19,puVar4,(uint64_t)puVar17,puVar11,puVar12,puVar16);
    sVar1 = local_40;
    uVar13 = (uint32_t)local_38;
    puVar17 = os + uVar13 * 9;
    local_100 = puVar17;
    puVar16[-1] = 0x1398aa;
    memcpy(puVar17,puVar16,sVar1);
    puVar15 = ctx_n;
    puVar17 = local_e0;
    puVar16[-1] = 0x1398c6;
    bn_almost_mont_sqr_u64(uVar13,puVar4,(uint64_t)puVar15,puVar17,puVar16);
    sVar1 = local_40;
    puVar17 = os + (uint)((int)local_70 * 5);
    puVar16[-1] = 0x1398e4;
    memcpy(puVar17,puVar16,sVar1);
    uVar19 = local_38;
    puVar12 = local_50;
    local_f8 = puVar17;
    puVar16[-1] = 0x139904;
    bn_almost_mont_mul_u64((uint32_t)uVar19,puVar12,(uint64_t)puVar15,puVar11,puVar17,puVar16);
    sVar1 = local_40;
    uVar13 = (uint32_t)local_38;
    puVar17 = os + (uVar13 + (int)local_68 * 2);
    local_f0 = puVar17;
    puVar16[-1] = 0x13992e;
    memcpy(puVar17,puVar16,sVar1);
    puVar4 = ctx_n;
    puVar12 = local_50;
    puVar17 = local_d8;
    puVar16[-1] = 0x139948;
    bn_almost_mont_sqr_u64(uVar13,puVar12,(uint64_t)puVar4,puVar17,puVar16);
    puVar17 = os + (uint)((int)local_a8 * 3);
    puVar16[-1] = 0x139968;
    memcpy(puVar17,puVar16,sVar1);
    puVar4 = ctx_n;
    puVar12 = local_50;
    uVar13 = (uint32_t)local_38;
    local_a8 = puVar17;
    puVar16[-1] = 0x13998c;
    bn_almost_mont_mul_u64(uVar13,puVar12,(uint64_t)puVar4,puVar11,puVar17,puVar16);
    sVar1 = local_40;
    puVar12 = os;
    puVar17 = os + (uVar13 + (int)local_a0 * 4);
    local_a0 = puVar17;
    puVar16[-1] = 0x1399b7;
    memcpy(puVar17,puVar16,sVar1);
    puVar15 = ctx_n;
    puVar4 = local_50;
    puVar17 = local_d0;
    puVar16[-1] = 0x1399d1;
    bn_almost_mont_sqr_u64(uVar13,puVar4,(uint64_t)puVar15,puVar17,puVar16);
    sVar1 = local_40;
    puVar12 = puVar12 + (uint)((int)local_108 - (int)local_70);
    puVar16[-1] = 0x1399f5;
    memcpy(puVar12,puVar16,sVar1);
    uVar19 = local_38;
    puVar17 = ctx_n;
    n_00 = local_50;
    local_70 = puVar12;
    puVar16[-1] = 0x139a16;
    bn_almost_mont_mul_u64((uint32_t)uVar19,n_00,(uint64_t)puVar17,puVar11,puVar12,puVar16);
    sVar1 = local_40;
    puVar17 = os + (uint)((int)local_68 * 3);
    puVar16[-1] = 0x139a34;
    memcpy(puVar17,puVar16,sVar1);
    uVar19 = local_38;
    sVar1 = local_40;
    nInv_u64 = ctx_n;
    puVar11 = os;
    puVar15 = local_60;
    puVar4 = local_80;
    puVar12 = local_98;
    if ((local_78 & 3) == 0) {
      puVar16[-1] = 0x139ebc;
      Hacl_Bignum_Montgomery_bn_from_mont_u64
                ((uint32_t)uVar19,n_00,(uint64_t)nInv_u64,puVar12,puVar15);
    }
    else {
      uVar19 = local_78 >> 6 & 0x3ffffff;
      bVar6 = (byte)local_78 & 0x3c;
      uVar8 = (uint)(b[uVar19] >> bVar6);
      if ((local_78 & 0x3c) != 0 && (uint)uVar19 < local_84) {
        uVar8 = uVar8 | (uint)(b[uVar19 + 1] << (-bVar6 & 0x3f));
      }
      uVar19 = (ulong)(uVar8 & 0xf);
      puVar16[-1] = 0x139a94;
      memcpy(puVar15,puVar11,sVar1);
      puVar16[-1] = 0x139aa1;
      uVar5 = FStar_UInt64_eq_mask(uVar19,1);
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar15[uVar10] = puVar15[uVar10] & ~uVar5 | puVar4[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x139adb;
      uVar5 = FStar_UInt64_eq_mask(uVar19,2);
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar15[uVar10] = puVar15[uVar10] & ~uVar5 | local_c0[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x139b1c;
      uVar5 = FStar_UInt64_eq_mask(uVar19,3);
      puVar12 = local_b8;
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar15[uVar10] = puVar15[uVar10] & ~uVar5 | local_e8[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x139b64;
      uVar5 = FStar_UInt64_eq_mask(uVar19,4);
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar15[uVar10] = puVar15[uVar10] & ~uVar5 | puVar12[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x139b9e;
      uVar5 = FStar_UInt64_eq_mask(uVar19,5);
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar15[uVar10] = puVar15[uVar10] & ~uVar5 | local_e0[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x139bdf;
      uVar5 = FStar_UInt64_eq_mask(uVar19,6);
      puVar12 = local_d0;
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar15[uVar10] = puVar15[uVar10] & ~uVar5 | local_d8[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x139c27;
      uVar5 = FStar_UInt64_eq_mask(uVar19,7);
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar15[uVar10] = puVar15[uVar10] & ~uVar5 | puVar12[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x139c61;
      uVar5 = FStar_UInt64_eq_mask(uVar19,8);
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar15[uVar10] = puVar15[uVar10] & ~uVar5 | local_b0[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x139ca2;
      uVar5 = FStar_UInt64_eq_mask(uVar19,9);
      puVar12 = local_f8;
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar15[uVar10] = puVar15[uVar10] & ~uVar5 | local_100[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x139cea;
      uVar5 = FStar_UInt64_eq_mask(uVar19,10);
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar15[uVar10] = puVar15[uVar10] & ~uVar5 | puVar12[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x139d24;
      uVar5 = FStar_UInt64_eq_mask(uVar19,0xb);
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar15[uVar10] = puVar15[uVar10] & ~uVar5 | local_f0[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x139d65;
      uVar5 = FStar_UInt64_eq_mask(uVar19,0xc);
      puVar12 = local_a0;
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar15[uVar10] = puVar15[uVar10] & ~uVar5 | local_a8[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x139dad;
      uVar5 = FStar_UInt64_eq_mask(uVar19,0xd);
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar15[uVar10] = puVar15[uVar10] & ~uVar5 | puVar12[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x139de7;
      uVar5 = FStar_UInt64_eq_mask(uVar19,0xe);
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar15[uVar10] = puVar15[uVar10] & ~uVar5 | local_70[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x139e25;
      uVar5 = FStar_UInt64_eq_mask(uVar19,0xf);
      if ((int)local_38 != 0) {
        uVar19 = 0;
        do {
          puVar15[uVar19] = puVar15[uVar19] & ~uVar5 | puVar17[uVar19] & uVar5;
          uVar19 = uVar19 + 1;
        } while (uVar20 != uVar19);
      }
    }
    sVar1 = local_40;
    puVar16 = (uint64_t *)((long)puVar16 - local_c8);
    puVar12 = (uint64_t *)0x0;
    local_98 = puVar17;
    puVar16[-1] = 0x139ee0;
    memset(puVar16,0,sVar1);
    uVar19 = local_78 >> 2;
    local_78 = (ulong)((uint)local_78 & 0xfffffffc);
    local_c8 = CONCAT44(local_c8._4_4_,
                        ((uint)uVar19 & 0x3fffffff) + (uint)((uVar19 & 0x3fffffff) == 0));
    puVar17 = local_50;
    do {
      uVar19 = local_38;
      puVar11 = ctx_n;
      puVar4 = local_60;
      local_68 = puVar12;
      puVar16[-1] = 0x139f24;
      uVar13 = (uint32_t)uVar19;
      bn_almost_mont_sqr_u64(uVar13,puVar17,(uint64_t)puVar11,puVar15,puVar4);
      puVar12 = local_60;
      puVar16[-1] = 0x139f3a;
      bn_almost_mont_sqr_u64(uVar13,puVar17,(uint64_t)puVar11,puVar12,puVar12);
      puVar12 = local_60;
      puVar16[-1] = 0x139f50;
      bn_almost_mont_sqr_u64(uVar13,puVar17,(uint64_t)puVar11,puVar12,puVar12);
      puVar15 = local_60;
      puVar16[-1] = 0x139f68;
      bn_almost_mont_sqr_u64(uVar13,puVar17,(uint64_t)puVar11,puVar15,puVar15);
      sVar1 = local_40;
      puVar12 = os;
      puVar17 = local_80;
      uVar9 = ((int)local_78 + (int)local_68 * -4) - 4;
      uVar8 = uVar9 >> 6;
      uVar9 = uVar9 & 0x3c;
      sVar7 = (sbyte)uVar9;
      uVar18 = (uint)(b[uVar8] >> sVar7);
      if (uVar9 != 0 && uVar8 < local_84) {
        uVar18 = uVar18 | (uint)(b[(ulong)uVar8 + 1] << (-sVar7 & 0x3fU));
      }
      uVar19 = (ulong)(uVar18 & 0xf);
      puVar16[-1] = 0x139fc7;
      memcpy(puVar16,puVar12,sVar1);
      puVar16[-1] = 0x139fd4;
      uVar5 = FStar_UInt64_eq_mask(uVar19,1);
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar16[uVar10] = puVar16[uVar10] & ~uVar5 | puVar17[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x13a00c;
      uVar5 = FStar_UInt64_eq_mask(uVar19,2);
      puVar17 = local_c0;
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar16[uVar10] = puVar16[uVar10] & ~uVar5 | puVar17[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x13a04b;
      uVar5 = FStar_UInt64_eq_mask(uVar19,3);
      puVar12 = local_b8;
      puVar17 = local_e8;
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar16[uVar10] = puVar16[uVar10] & ~uVar5 | puVar17[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x13a091;
      uVar5 = FStar_UInt64_eq_mask(uVar19,4);
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar16[uVar10] = puVar16[uVar10] & ~uVar5 | puVar12[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x13a0c9;
      uVar5 = FStar_UInt64_eq_mask(uVar19,5);
      puVar17 = local_e0;
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar16[uVar10] = puVar16[uVar10] & ~uVar5 | puVar17[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x13a108;
      uVar5 = FStar_UInt64_eq_mask(uVar19,6);
      puVar12 = local_d0;
      puVar17 = local_d8;
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar16[uVar10] = puVar16[uVar10] & ~uVar5 | puVar17[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x13a14e;
      uVar5 = FStar_UInt64_eq_mask(uVar19,7);
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar16[uVar10] = puVar16[uVar10] & ~uVar5 | puVar12[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x13a186;
      uVar5 = FStar_UInt64_eq_mask(uVar19,8);
      puVar17 = local_b0;
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar16[uVar10] = puVar16[uVar10] & ~uVar5 | puVar17[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x13a1c5;
      uVar5 = FStar_UInt64_eq_mask(uVar19,9);
      puVar12 = local_f8;
      puVar17 = local_100;
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar16[uVar10] = puVar16[uVar10] & ~uVar5 | puVar17[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x13a20b;
      uVar5 = FStar_UInt64_eq_mask(uVar19,10);
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar16[uVar10] = puVar16[uVar10] & ~uVar5 | puVar12[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x13a243;
      uVar5 = FStar_UInt64_eq_mask(uVar19,0xb);
      puVar17 = local_f0;
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar16[uVar10] = puVar16[uVar10] & ~uVar5 | puVar17[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x13a282;
      uVar5 = FStar_UInt64_eq_mask(uVar19,0xc);
      puVar12 = local_a0;
      puVar17 = local_a8;
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar16[uVar10] = puVar16[uVar10] & ~uVar5 | puVar17[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x13a2c8;
      uVar5 = FStar_UInt64_eq_mask(uVar19,0xd);
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar16[uVar10] = puVar16[uVar10] & ~uVar5 | puVar12[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x13a300;
      uVar5 = FStar_UInt64_eq_mask(uVar19,0xe);
      puVar17 = local_70;
      if ((int)local_38 != 0) {
        uVar10 = 0;
        do {
          puVar16[uVar10] = puVar16[uVar10] & ~uVar5 | puVar17[uVar10] & uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar20 != uVar10);
      }
      puVar16[-1] = 0x13a33c;
      uVar5 = FStar_UInt64_eq_mask(uVar19,0xf);
      puVar12 = local_68;
      puVar17 = local_98;
      uVar13 = (uint32_t)local_38;
      if (uVar13 != 0) {
        uVar19 = 0;
        do {
          puVar16[uVar19] = puVar16[uVar19] & ~uVar5 | puVar17[uVar19] & uVar5;
          uVar19 = uVar19 + 1;
        } while (uVar20 != uVar19);
      }
      puVar4 = ctx_n;
      puVar17 = local_50;
      puVar16[-1] = 0x13a38d;
      bn_almost_mont_mul_u64(uVar13,puVar17,(uint64_t)puVar4,puVar15,puVar16,puVar15);
      uVar13 = (uint32_t)local_38;
      uVar8 = (int)puVar12 + 1;
      puVar12 = (uint64_t *)(ulong)uVar8;
    } while (uVar8 != (uint)local_c8);
  }
  puVar12 = ctx_n;
  puVar17 = ctx_r2;
  puVar16[-1] = 0x13a3b6;
  Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar13,puVar17,(uint64_t)puVar12,puVar15,res);
  return;
}

Assistant:

void
Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64(
  uint32_t len,
  uint64_t *n,
  uint64_t mu,
  uint64_t *r2,
  uint64_t *a,
  uint32_t bBits,
  uint64_t *b,
  uint64_t *res
)
{
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint64_t), len);
    uint64_t aM[len];
    memset(aM, 0U, len * sizeof (uint64_t));
    Hacl_Bignum_Montgomery_bn_to_mont_u64(len, n, mu, r2, a, aM);
    KRML_CHECK_SIZE(sizeof (uint64_t), len);
    uint64_t resM[len];
    memset(resM, 0U, len * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), len + len);
    uint64_t ctx[len + len];
    memset(ctx, 0U, (len + len) * sizeof (uint64_t));
    memcpy(ctx, n, len * sizeof (uint64_t));
    memcpy(ctx + len, r2, len * sizeof (uint64_t));
    uint64_t sw = 0ULL;
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + len;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len, ctx_n, mu, ctx_r2, resM);
    for (uint32_t i0 = 0U; i0 < bBits; i0++)
    {
      uint32_t i1 = (bBits - i0 - 1U) / 64U;
      uint32_t j = (bBits - i0 - 1U) % 64U;
      uint64_t tmp = b[i1];
      uint64_t bit = tmp >> j & 1ULL;
      uint64_t sw1 = bit ^ sw;
      for (uint32_t i = 0U; i < len; i++)
      {
        uint64_t dummy = (0ULL - sw1) & (resM[i] ^ aM[i]);
        resM[i] = resM[i] ^ dummy;
        aM[i] = aM[i] ^ dummy;
      }
      uint64_t *ctx_n0 = ctx;
      bn_almost_mont_mul_u64(len, ctx_n0, mu, aM, resM, aM);
      uint64_t *ctx_n1 = ctx;
      bn_almost_mont_sqr_u64(len, ctx_n1, mu, resM, resM);
      sw = bit;
    }
    uint64_t sw0 = sw;
    for (uint32_t i = 0U; i < len; i++)
    {
      uint64_t dummy = (0ULL - sw0) & (resM[i] ^ aM[i]);
      resM[i] = resM[i] ^ dummy;
      aM[i] = aM[i] ^ dummy;
    }
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len, n, mu, resM, res);
    return;
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t aM[len];
  memset(aM, 0U, len * sizeof (uint64_t));
  Hacl_Bignum_Montgomery_bn_to_mont_u64(len, n, mu, r2, a, aM);
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t resM[len];
  memset(resM, 0U, len * sizeof (uint64_t));
  uint32_t bLen;
  if (bBits == 0U)
  {
    bLen = 1U;
  }
  else
  {
    bLen = (bBits - 1U) / 64U + 1U;
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), len + len);
  uint64_t ctx[len + len];
  memset(ctx, 0U, (len + len) * sizeof (uint64_t));
  memcpy(ctx, n, len * sizeof (uint64_t));
  memcpy(ctx + len, r2, len * sizeof (uint64_t));
  KRML_CHECK_SIZE(sizeof (uint64_t), 16U * len);
  uint64_t table[16U * len];
  memset(table, 0U, 16U * len * sizeof (uint64_t));
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t tmp[len];
  memset(tmp, 0U, len * sizeof (uint64_t));
  uint64_t *t0 = table;
  uint64_t *t1 = table + len;
  uint64_t *ctx_n0 = ctx;
  uint64_t *ctx_r20 = ctx + len;
  Hacl_Bignum_Montgomery_bn_from_mont_u64(len, ctx_n0, mu, ctx_r20, t0);
  memcpy(t1, aM, len * sizeof (uint64_t));
  KRML_MAYBE_FOR7(i,
    0U,
    7U,
    1U,
    uint64_t *t11 = table + (i + 1U) * len;
    uint64_t *ctx_n1 = ctx;
    bn_almost_mont_sqr_u64(len, ctx_n1, mu, t11, tmp);
    memcpy(table + (2U * i + 2U) * len, tmp, len * sizeof (uint64_t));
    uint64_t *t2 = table + (2U * i + 2U) * len;
    uint64_t *ctx_n = ctx;
    bn_almost_mont_mul_u64(len, ctx_n, mu, aM, t2, tmp);
    memcpy(table + (2U * i + 3U) * len, tmp, len * sizeof (uint64_t)););
  if (bBits % 4U != 0U)
  {
    uint32_t i0 = bBits / 4U * 4U;
    uint64_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, i0, 4U);
    memcpy(resM, (uint64_t *)(table + 0U * len), len * sizeof (uint64_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint64_t c = FStar_UInt64_eq_mask(bits_c, (uint64_t)(i1 + 1U));
      const uint64_t *res_j = table + (i1 + 1U) * len;
      for (uint32_t i = 0U; i < len; i++)
      {
        uint64_t *os = resM;
        uint64_t x = (c & res_j[i]) | (~c & resM[i]);
        os[i] = x;
      });
  }
  else
  {
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + len;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len, ctx_n, mu, ctx_r2, resM);
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t tmp0[len];
  memset(tmp0, 0U, len * sizeof (uint64_t));
  for (uint32_t i0 = 0U; i0 < bBits / 4U; i0++)
  {
    KRML_MAYBE_FOR4(i,
      0U,
      4U,
      1U,
      uint64_t *ctx_n = ctx;
      bn_almost_mont_sqr_u64(len, ctx_n, mu, resM, resM););
    uint32_t k = bBits - bBits % 4U - 4U * i0 - 4U;
    uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, k, 4U);
    memcpy(tmp0, (uint64_t *)(table + 0U * len), len * sizeof (uint64_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint64_t c = FStar_UInt64_eq_mask(bits_l, (uint64_t)(i1 + 1U));
      const uint64_t *res_j = table + (i1 + 1U) * len;
      for (uint32_t i = 0U; i < len; i++)
      {
        uint64_t *os = tmp0;
        uint64_t x = (c & res_j[i]) | (~c & tmp0[i]);
        os[i] = x;
      });
    uint64_t *ctx_n = ctx;
    bn_almost_mont_mul_u64(len, ctx_n, mu, resM, tmp0, resM);
  }
  Hacl_Bignum_Montgomery_bn_from_mont_u64(len, n, mu, resM, res);
}